

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::neverReturn(TestMoreStuffImpl *this,NeverReturnContext context)

{
  undefined1 node [8];
  ClientHook *pCVar1;
  WirePointer *pWVar2;
  int iVar3;
  long *in_RDX;
  Promise<void> promise;
  undefined1 local_d8 [8];
  Own<capnp::ClientHook,_std::nullptr_t> local_d0;
  PromiseBase local_c0;
  PointerReader local_b8;
  undefined1 local_98 [32];
  StructReader local_78;
  StructBuilder local_48;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  kj::_::neverDone();
  local_d8 = (undefined1  [8])local_78.segment;
  (**(code **)*in_RDX)(local_98);
  local_48.data = (void *)local_98._16_8_;
  local_48.pointers = (WirePointer *)local_98._24_8_;
  local_48.segment = (SegmentBuilder *)local_98._0_8_;
  local_48.capTable = (CapTableBuilder *)local_98._8_8_;
  PointerReader::getStruct(&local_78,(PointerReader *)&local_48,(word *)0x0);
  local_48.data = local_78.pointers;
  iVar3 = local_78.nestingLimit;
  if (local_78.pointerCount == 0) {
    local_78.capTable = (CapTableReader *)0x0;
    local_78.segment = (SegmentReader *)0x0;
    local_48.data = (WirePointer *)0x0;
    iVar3 = 0x7fffffff;
  }
  local_48.pointers = (WirePointer *)CONCAT44(local_48.pointers._4_4_,iVar3);
  local_48.segment = (SegmentBuilder *)local_78.segment;
  local_48.capTable = (CapTableBuilder *)local_78.capTable;
  PointerReader::getCapability((PointerReader *)local_98);
  local_b8.capTable = (CapTableReader *)local_98._0_8_;
  local_b8.pointer = (WirePointer *)local_98._8_8_;
  local_b8.segment = (SegmentReader *)&Capability::Client::typeinfo;
  kj::Promise<void>::attach<capnproto_test::capnp::test::TestInterface::Client>
            ((Promise<void> *)&local_c0,(Client *)local_d8);
  pWVar2 = local_b8.pointer;
  if (local_b8.pointer != (WirePointer *)0x0) {
    local_b8.pointer = (WirePointer *)0x0;
    (*(code *)((SegmentReader *)&(local_b8.capTable)->_vptr_CapTableReader)->arena->_vptr_Arena)
              (local_b8.capTable,
               (long)&(pWVar2->offsetAndKind).value + *(long *)((long)*pWVar2 + -0x10));
  }
  node = local_d8;
  if (local_d8 != (undefined1  [8])0x0) {
    local_d8 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  local_b8.segment = (SegmentReader *)((ulong)local_b8.segment & 0xffffffffffffff00);
  (**(code **)(*in_RDX + 0x10))(local_98);
  local_78.data = (void *)local_98._16_8_;
  local_78.segment = (SegmentReader *)local_98._0_8_;
  local_78.capTable = (CapTableReader *)local_98._8_8_;
  PointerBuilder::getStruct(&local_48,(PointerBuilder *)&local_78,(StructSize)0x10000,(word *)0x0);
  (**(code **)*in_RDX)(&local_b8);
  local_98._16_8_ = local_b8.pointer;
  local_98._24_8_ = local_b8._24_8_;
  local_98._0_8_ = local_b8.segment;
  local_98._8_8_ = local_b8.capTable;
  PointerReader::getStruct(&local_78,(PointerReader *)local_98,(word *)0x0);
  local_98._8_8_ = local_78.capTable;
  local_98._0_8_ = local_78.segment;
  if (local_78.pointerCount == 0) {
    local_78.nestingLimit = 0x7fffffff;
    local_78.pointers = (WirePointer *)0x0;
    local_98._8_8_ = (WirePointer *)0x0;
    local_98._0_8_ = (SegmentBuilder *)0x0;
  }
  local_98._24_4_ = local_78.nestingLimit;
  local_98._16_8_ = local_78.pointers;
  PointerReader::getCapability(&local_b8);
  local_d0.disposer = (Disposer *)local_b8.segment;
  local_d0.ptr = (ClientHook *)local_b8.capTable;
  local_d8 = (undefined1  [8])&Capability::Client::typeinfo;
  local_98._0_8_ = local_48.segment;
  local_98._8_8_ = local_48.capTable;
  local_98._16_8_ = local_48.pointers;
  PointerBuilder::setCapability((PointerBuilder *)local_98,&local_d0);
  pCVar1 = local_d0.ptr;
  if ((SegmentBuilder *)local_d0.ptr != (SegmentBuilder *)0x0) {
    local_d0.ptr = (ClientHook *)0x0;
    (*(code *)((SegmentReader *)&(local_d0.disposer)->_vptr_Disposer)->arena->_vptr_Arena)
              (local_d0.disposer,
               (long)&((SegmentReader *)&pCVar1->_vptr_ClientHook)->arena +
               (long)((SegmentReader *)&pCVar1->_vptr_ClientHook)->arena[-2]._vptr_Arena);
  }
  *(OwnPromiseNode *)&this->super_Server = local_c0.node.ptr;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::neverReturn(NeverReturnContext context) {
  ++callCount;

  // Attach `cap` to the promise to make sure it is released.
  auto promise = kj::Promise<void>(kj::NEVER_DONE).attach(context.getParams().getCap());

  // Also attach `cap` to the result struct to make sure that is released.
  context.getResults().setCapCopy(context.getParams().getCap());

  return kj::mv(promise);
}